

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::FeatureType::ByteSizeLong(FeatureType *this)

{
  DictionaryFeatureType *pDVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  
  sVar6 = (ulong)this->isoptional_ * 3;
  switch(this->_oneof_case_[0]) {
  case 1:
  case 2:
  case 3:
    ((this->Type_).int64type_)->_cached_size_ = 0;
    sVar6 = sVar6 + 2;
    goto switchD_00446c79_default;
  case 4:
    sVar4 = ImageFeatureType::ByteSizeLong((this->Type_).imagetype_);
    break;
  case 5:
    sVar4 = ArrayFeatureType::ByteSizeLong((this->Type_).multiarraytype_);
    break;
  case 6:
    pDVar1 = (this->Type_).dictionarytype_;
    if (pDVar1->_oneof_case_[0] - 1 < 2) {
      ((pDVar1->KeyType_).int64keytype_)->_cached_size_ = 0;
      lVar5 = 2;
    }
    else {
      lVar5 = 0;
    }
    pDVar1->_cached_size_ = (int)lVar5;
    sVar6 = sVar6 + lVar5 + 2;
    goto switchD_00446c79_default;
  case 7:
    sVar4 = SequenceFeatureType::ByteSizeLong((this->Type_).sequencetype_);
    break;
  default:
    goto switchD_00446c79_default;
  }
  uVar3 = (uint)sVar4 | 1;
  iVar2 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  sVar6 = sVar6 + sVar4 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
switchD_00446c79_default:
  this->_cached_size_ = (int)sVar6;
  return sVar6;
}

Assistant:

size_t FeatureType::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.FeatureType)
  size_t total_size = 0;

  // bool isOptional = 1000;
  if (this->isoptional() != 0) {
    total_size += 2 + 1;
  }

  switch (Type_case()) {
    // .CoreML.Specification.Int64FeatureType int64Type = 1;
    case kInt64Type: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.int64type_);
      break;
    }
    // .CoreML.Specification.DoubleFeatureType doubleType = 2;
    case kDoubleType: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.doubletype_);
      break;
    }
    // .CoreML.Specification.StringFeatureType stringType = 3;
    case kStringType: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.stringtype_);
      break;
    }
    // .CoreML.Specification.ImageFeatureType imageType = 4;
    case kImageType: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.imagetype_);
      break;
    }
    // .CoreML.Specification.ArrayFeatureType multiArrayType = 5;
    case kMultiArrayType: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.multiarraytype_);
      break;
    }
    // .CoreML.Specification.DictionaryFeatureType dictionaryType = 6;
    case kDictionaryType: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.dictionarytype_);
      break;
    }
    // .CoreML.Specification.SequenceFeatureType sequenceType = 7;
    case kSequenceType: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.sequencetype_);
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}